

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ObjRecognizeExor(Gia_Obj_t *pObj,Gia_Obj_t **ppFan0,Gia_Obj_t **ppFan1)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if (((ulong)pObj & 1) == 0) {
    uVar3 = *(ulong *)pObj;
    uVar8 = uVar3 & 0x1fffffff;
    iVar5 = 0;
    iVar6 = 0;
    if (uVar8 != 0x1fffffff && -1 < (int)(uint)uVar3) {
      uVar7 = (uint)uVar3 & 0x1fffffff;
      iVar6 = 0;
      if (((~uVar3 & 0x2000000020000000) == 0) &&
         (iVar6 = iVar5, uVar7 == 0x1fffffff || uVar7 != ((uint)(uVar3 >> 0x20) & 0x1fffffff))) {
        uVar4 = *(ulong *)(pObj + -uVar8);
        if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
          pGVar1 = pObj + -(uVar3 >> 0x20 & 0x1fffffff);
          uVar3 = *(ulong *)pGVar1;
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            pGVar2 = pObj + -uVar8;
            if (((pGVar2 + -(uVar4 & 0x1fffffff) == pGVar1 + -(uVar3 & 0x1fffffff)) &&
                (pGVar2 + -(uVar4 >> 0x20 & 0x1fffffff) == pGVar1 + -(uVar3 >> 0x20 & 0x1fffffff)))
               && ((~(uVar3 ^ uVar4) & 0x2000000020000000) == 0)) {
              *ppFan0 = (Gia_Obj_t *)
                        ((ulong)((uint)(uVar4 >> 0x1d) & 1) |
                        (ulong)(pGVar2 + -(uVar4 & 0x1fffffff)));
              uVar7 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
              *ppFan1 = (Gia_Obj_t *)
                        ((ulong)(uVar7 >> 0x1d & 1) | (ulong)(pGVar2 + -(ulong)(uVar7 & 0x1fffffff))
                        );
              iVar6 = 1;
            }
          }
        }
      }
    }
    return iVar6;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x39c,"int Gia_ObjRecognizeExor(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
}

Assistant:

int Gia_ObjRecognizeExor( Gia_Obj_t * pObj, Gia_Obj_t ** ppFan0, Gia_Obj_t ** ppFan1 )
{
    Gia_Obj_t * p0, * p1;
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjIsBuf(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    p0 = Gia_ObjChild0(pObj);
    p1 = Gia_ObjChild1(pObj);
    if ( !Gia_IsComplement(p0) || !Gia_IsComplement(p1) )
        return 0;
    p0 = Gia_Regular(p0);
    p1 = Gia_Regular(p1);
    if ( !Gia_ObjIsAnd(p0) || !Gia_ObjIsAnd(p1) )
        return 0;
    if ( Gia_ObjFanin0(p0) != Gia_ObjFanin0(p1) || Gia_ObjFanin1(p0) != Gia_ObjFanin1(p1) )
        return 0;
    if ( Gia_ObjFaninC0(p0) == Gia_ObjFaninC0(p1) || Gia_ObjFaninC1(p0) == Gia_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Gia_ObjChild0(p0);
    *ppFan1 = Gia_ObjChild1(p0);
    return 1;
}